

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

void nn_sws_acknowledge_close_handshake(nn_sws *self)

{
  size_t sVar1;
  uint8_t *buf;
  uint16_t uVar2;
  uint uVar3;
  ulong uVar4;
  char *reason;
  uint8_t *buffer;
  ulong len;
  
  sVar1 = self->inmsg_current_chunk_len;
  if (sVar1 == 0) {
    reason = "";
    uVar3 = 1000;
  }
  else {
    if (sVar1 == 1) {
LAB_001ab081:
      nn_sws_acknowledge_close_handshake_cold_1();
    }
    buf = self->inmsg_current_chunk_buf;
    len = sVar1 - 2;
    if (len != 0) {
      buffer = buf + 2;
      do {
        uVar3 = nn_utf8_code_point(buffer,len);
        if ((int)uVar3 < 1) {
          reason = "Invalid UTF-8 sent as Close Reason.";
          goto LAB_001ab04b;
        }
        uVar4 = (ulong)uVar3;
        if (len < uVar4) {
          nn_sws_acknowledge_close_handshake_cold_2();
          goto LAB_001ab081;
        }
        buffer = buffer + uVar4;
        len = len - uVar4;
      } while (len != 0);
    }
    uVar2 = nn_gets(buf);
    uVar3 = (uint)uVar2;
    if (((uVar2 - 1000 < 0xc) && ((0xf8fU >> (uVar2 - 1000 & 0x1f) & 1) != 0)) ||
       ((ushort)(uVar2 - 3000) < 2000)) {
      reason = "";
    }
    else {
      reason = "Unrecognized close code.";
LAB_001ab04b:
      uVar3 = 0x3ea;
    }
  }
  nn_sws_fail_conn(self,uVar3,reason);
  return;
}

Assistant:

static void nn_sws_acknowledge_close_handshake (struct nn_sws *self)
{
    uint8_t *pos;
    uint16_t close_code;
    int code_point_len;
    size_t len;

    len = self->inmsg_current_chunk_len;
    pos = self->inmsg_current_chunk_buf;

    /*  Peer did not provide a Close Code, so choose our own here. */
    if (len == 0) {
        nn_sws_fail_conn (self, NN_SWS_CLOSE_NORMAL, "");
        return;
    }

    /*  If the payload is not even long enough for the required 2-octet
        Close Code, the connection should have already been failed. */
    nn_assert (len >= NN_SWS_CLOSE_CODE_LEN);
    len -= NN_SWS_CLOSE_CODE_LEN;
    pos += NN_SWS_CLOSE_CODE_LEN;

    /*  As per RFC 6455 7.1.6, the Close Reason following the Close Code
        must be well-formed UTF-8. */
    while (len > 0) {
        code_point_len = nn_utf8_code_point (pos, len);

        if (code_point_len > 0) {
            /*  Valid code point found; continue validating. */
            nn_assert (len >= (size_t) code_point_len);
            len -= code_point_len;
            pos += code_point_len;
            continue;
        }
        else {
            /*  RFC 6455 7.1.6 */
            nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_PROTO,
                "Invalid UTF-8 sent as Close Reason.");
            return;
        }
    }

    /*  Entire Close Reason is well-formed UTF-8 (or empty) */
    nn_assert (len == 0);

    close_code = nn_gets (self->inmsg_current_chunk_buf);

    if (close_code == NN_SWS_CLOSE_NORMAL ||
        close_code == NN_SWS_CLOSE_GOING_AWAY ||
        close_code == NN_SWS_CLOSE_ERR_PROTO ||
        close_code == NN_SWS_CLOSE_ERR_WUT ||
        close_code == NN_SWS_CLOSE_ERR_INVALID_FRAME ||
        close_code == NN_SWS_CLOSE_ERR_POLICY ||
        close_code == NN_SWS_CLOSE_ERR_TOOBIG ||
        close_code == NN_SWS_CLOSE_ERR_EXTENSION ||
        close_code == NN_SWS_CLOSE_ERR_SERVER ||
        (close_code >= 3000 && close_code <= 3999) ||
        (close_code >= 4000 && close_code <= 4999)) {
        /*  Repeat close code, per RFC 6455 7.4.1 and 7.4.2 */
        nn_sws_fail_conn (self, (int) close_code, "");
    }
    else {
        nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_PROTO,
            "Unrecognized close code.");
    }

    return;
}